

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TexBindingCase::init
          (TexBindingCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType ctxType;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  NotSupportedError *pNVar3;
  string local_40;
  int iVar2;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    if (this->m_texTarget == 0x9102) {
      bVar1 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_texture_storage_multisample_2d_array");
      iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
      if (!bVar1) {
        pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "Test requires OES_texture_storage_multisample_2d_array extension","");
        tcu::NotSupportedError::NotSupportedError(pNVar3,&local_40);
        __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    if (this->m_texTarget == 0x9009) {
      bVar1 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_EXT_texture_cube_map_array");
      iVar2 = (int)CONCAT71(extraout_var_01,bVar1);
      if (!bVar1) {
        pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Test requires GL_EXT_texture_cube_map_array extension","");
        tcu::NotSupportedError::NotSupportedError(pNVar3,&local_40);
        __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    if (this->m_texTarget == 0x8c2a) {
      bVar1 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
      iVar2 = (int)CONCAT71(extraout_var_02,bVar1);
      if (!bVar1) {
        pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Test requires GL_EXT_texture_buffer extension","");
        tcu::NotSupportedError::NotSupportedError(pNVar3,&local_40);
        __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return iVar2;
}

Assistant:

void TexBindingCase::init (void)
{
	if (contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		return;

	if (m_texTarget == GL_TEXTURE_2D_MULTISAMPLE_ARRAY && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		throw tcu::NotSupportedError("Test requires OES_texture_storage_multisample_2d_array extension");
	if (m_texTarget == GL_TEXTURE_CUBE_MAP_ARRAY && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_cube_map_array"))
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_cube_map_array extension");
	if (m_texTarget == GL_TEXTURE_BUFFER && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"))
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_buffer extension");
}